

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FILongDecoder::decode(FILongDecoder *this,uint8_t *data,size_t len)

{
  ulong uVar1;
  DeadlyImportError *this_00;
  ulong in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ulong uVar3;
  shared_ptr<const_Assimp::FIValue> sVar4;
  vector<long,_std::allocator<long>_> value;
  int64_t v;
  undefined1 local_69;
  vector<long,_std::allocator<long>_> local_68;
  FILongDecoder local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  if ((in_RCX & 7) == 0) {
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    std::vector<long,_std::allocator<long>_>::reserve(&local_68,in_RCX >> 3);
    if (in_RCX != 0) {
      uVar3 = 0;
      do {
        uVar1 = *(ulong *)(len + uVar3 * 8);
        local_48 = (FILongDecoder)
                   (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                    (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                    (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                    (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
        if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&local_68,
                     (iterator)
                     local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(long *)&local_48);
        }
        else {
          *local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish = (long)local_48;
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar3 = uVar3 + 1;
      } while (in_RCX >> 3 != uVar3);
    }
    local_48 = (FILongDecoder)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Assimp::FILongValueImpl,std::allocator<Assimp::FILongValueImpl>,std::vector<long,std::allocator<long>>>
              (a_Stack_40,(FILongValueImpl **)&local_48,
               (allocator<Assimp::FILongValueImpl> *)&local_69,&local_68);
    *this = local_48;
    this[1] = (FILongDecoder)a_Stack_40[0]._M_pi;
    _Var2._M_pi = extraout_RDX;
    if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
      _Var2._M_pi = extraout_RDX_00;
    }
    sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_Assimp::FIValue>)
           sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 7) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<int64_t> value;
        size_t numLongs = len / 8;
        value.reserve(numLongs);
        for (size_t i = 0; i < numLongs; ++i) {
            int64_t b0 = data[0], b1 = data[1], b2 = data[2], b3 = data[3], b4 = data[4], b5 = data[5], b6 = data[6], b7 = data[7];
            int64_t v = (b0 << 56) | (b1 << 48) | (b2 << 40) | (b3 << 32) | (b4 << 24) | (b5 << 16) | (b6 << 8) | b7;
            value.push_back(v);
            data += 8;
        }
        return FILongValue::create(std::move(value));
    }